

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

ssize_t Curl_bufq_write_pass
                  (bufq *q,uchar *buf,size_t len,Curl_bufq_writer *writer,void *writer_ctx,
                  CURLcode *err)

{
  _Bool _Var1;
  ssize_t sVar2;
  CURLcode CVar3;
  ulong uVar4;
  
  *err = CURLE_OK;
  uVar4 = 0;
  do {
    if (len == 0) {
      CVar3 = CURLE_OK;
LAB_00112965:
      *err = CVar3;
      return uVar4;
    }
    _Var1 = Curl_bufq_is_full(q);
    if ((_Var1) && (sVar2 = Curl_bufq_pass(q,writer,writer_ctx,err), sVar2 < 0)) {
LAB_00112947:
      if (*err != CURLE_AGAIN) {
        return -1;
      }
LAB_0011294c:
      CVar3 = CURLE_AGAIN;
      if (uVar4 != 0) {
        CVar3 = CURLE_OK;
      }
      uVar4 = uVar4 | -(ulong)(uVar4 == 0);
      goto LAB_00112965;
    }
    sVar2 = Curl_bufq_write(q,buf,len,err);
    if (sVar2 < 0) goto LAB_00112947;
    if (sVar2 == 0) goto LAB_0011294c;
    buf = buf + sVar2;
    len = len - sVar2;
    uVar4 = uVar4 + sVar2;
  } while( true );
}

Assistant:

ssize_t Curl_bufq_write_pass(struct bufq *q,
                             const unsigned char *buf, size_t len,
                             Curl_bufq_writer *writer, void *writer_ctx,
                             CURLcode *err)
{
  ssize_t nwritten = 0, n;

  *err = CURLE_OK;
  while(len) {
    if(Curl_bufq_is_full(q)) {
      /* try to make room in case we are full */
      n = Curl_bufq_pass(q, writer, writer_ctx, err);
      if(n < 0) {
        if(*err != CURLE_AGAIN) {
          /* real error, fail */
          return -1;
        }
        /* would block, bufq is full, give up */
        break;
      }
    }

    /* Add whatever is remaining now to bufq */
    n = Curl_bufq_write(q, buf, len, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        /* real error, fail */
        return -1;
      }
      /* no room in bufq */
      break;
    }
    /* edge case of writer returning 0 (and len is >0)
     * break or we might enter an infinite loop here */
    if(n == 0)
      break;

    /* Maybe only part of `data` has been added, continue to loop */
    buf += (size_t)n;
    len -= (size_t)n;
    nwritten += (size_t)n;
  }

  if(!nwritten && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}